

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  float prev_cost;
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  int distance;
  CostCacheInterval *cur;
  uint16_t *dist_array;
  CostModel *m;
  CostManager *manager;
  VP8LHistogram *p;
  CostCacheInterval *pCVar5;
  float *cost;
  ushort *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint64_t uVar11;
  uint16_t *puVar12;
  ulong uVar13;
  uint uVar14;
  uint dist;
  double *pdVar15;
  ulong uVar16;
  uint len;
  uint uVar17;
  int idx;
  uint64_t nmemb;
  uint16_t *puVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  int local_c0;
  int code;
  byte local_88;
  PixOrCopy *local_80;
  uint64_t local_78;
  VP8LHashChain *local_70;
  int extra_bits;
  double local_60;
  VP8LBackwardRefs *local_58;
  long local_50;
  double *local_48;
  VP8LColorCache local_40;
  
  uVar17 = ysize * xsize;
  local_78 = (uint64_t)(int)uVar17;
  local_70 = hash_chain;
  dist_array = (uint16_t *)WebPSafeMalloc(local_78,2);
  if (dist_array == (uint16_t *)0x0) {
    uVar17 = 0;
    goto LAB_00138de8;
  }
  iVar4 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar4 = 0x118;
  }
  uVar11 = 1;
  local_58 = refs_src;
  m = (CostModel *)WebPSafeCalloc(1,(long)iVar4 * 8 + 0x1948);
  manager = (CostManager *)WebPSafeMalloc(1,0x8178);
  bVar19 = false;
  if (manager != (CostManager *)0x0 && m != (CostModel *)0x0) {
    m->literal_ = m[1].alpha_;
    if (0 < cache_bits) {
      iVar4 = VP8LColorCacheInit(&local_40,cache_bits);
      bVar19 = false;
      if (iVar4 == 0) goto LAB_00138c38;
    }
    VP8LRefsCursorInit((VP8LRefsCursor *)&code,local_58);
    p = VP8LAllocateHistogram(cache_bits);
    if (p == (VP8LHistogram *)0x0) {
      bVar19 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      VP8LHistogramInit(p,cache_bits,1);
      while (_code != (PixOrCopy *)0x0) {
        VP8LHistogramAddSinglePixOrCopy(p,_code,VP8LDistanceToPlaneCode,xsize);
        _code = _code + 1;
        if (_code == local_80) {
          VP8LRefsCursorNextBlock((VP8LRefsCursor *)&code);
        }
      }
      iVar4 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
      if (p->palette_code_bits_ < 1) {
        iVar4 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar4,p->literal_,m->literal_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->red_,m->red_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,m->blue_);
      ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,(double *)m);
      local_48 = m->distance_;
      ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_48);
      VP8LFreeHistogram(p);
      uVar14 = 0xfff;
      if ((int)uVar17 < 0xfff) {
        uVar14 = uVar17;
      }
      manager->costs_ = (float *)0x0;
      manager->cache_intervals_ = (CostCacheInterval *)0x0;
      manager->head_ = (CostInterval *)0x0;
      manager->recycled_intervals_ = (CostInterval *)0x0;
      manager->count_ = 0;
      manager->dist_array_ = dist_array;
      CostManagerInitFreeList(manager);
      manager->cache_intervals_size_ = 1;
      dVar20 = GetLengthCost(m,0);
      manager->cost_cache_[0] = dVar20;
      pdVar15 = manager->cost_cache_;
      nmemb = uVar11;
      for (; pdVar15 = pdVar15 + 1, (long)uVar11 < (long)(int)uVar14; uVar11 = uVar11 + 1) {
        dVar21 = GetLengthCost(m,(uint32_t)uVar11);
        *pdVar15 = dVar21;
        if ((dVar21 != dVar20) || (NAN(dVar21) || NAN(dVar20))) {
          nmemb = nmemb + 1;
          manager->cache_intervals_size_ = nmemb;
        }
        dVar20 = dVar21;
      }
      pCVar5 = (CostCacheInterval *)WebPSafeMalloc(nmemb,0x10);
      manager->cache_intervals_ = pCVar5;
      if (pCVar5 != (CostCacheInterval *)0x0) {
        pCVar5->start_ = 0;
        pCVar5->end_ = 1;
        dVar20 = manager->cost_cache_[0];
        pCVar5->cost_ = dVar20;
        lVar10 = 5;
        for (lVar7 = 1; lVar7 < (int)uVar14; lVar7 = lVar7 + 1) {
          dVar21 = manager->cost_cache_[lVar10 + -4];
          if ((dVar21 != dVar20) || (NAN(dVar21) || NAN(dVar20))) {
            pCVar5[1].start_ = (int)lVar7;
            pCVar5[1].cost_ = dVar21;
            pCVar5 = pCVar5 + 1;
            dVar20 = dVar21;
          }
          pCVar5->end_ = (int)lVar10 + -3;
          lVar10 = lVar10 + 1;
        }
        cost = (float *)WebPSafeMalloc(local_78,4);
        manager->costs_ = cost;
        if (cost != (float *)0x0) {
          uVar8 = 0;
          uVar13 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar13 = uVar8;
          }
          for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            cost[uVar8] = 1e+38;
          }
          *dist_array = 0;
          local_50 = 0;
          AddSingleLiteralWithCostModel
                    (argb,&local_40,m,0,(uint)(0 < cache_bits),0.0,cost,dist_array);
          local_60 = -1.0;
          local_c0 = -1;
          iVar4 = 0;
          uVar17 = 0xffffffff;
          uVar14 = 0xffffffff;
          for (lVar7 = 1; lVar7 < (long)local_78; lVar7 = lVar7 + 1) {
            prev_cost = manager->costs_[lVar7 + -1];
            dist = local_70->offset_length_[lVar7] >> 0xc;
            len = local_70->offset_length_[lVar7] & 0xfff;
            idx = (int)lVar7;
            AddSingleLiteralWithCostModel
                      (argb,&local_40,m,idx,(uint)(0 < cache_bits),prev_cost,manager->costs_,
                       dist_array);
            if (1 < len) {
              if (dist == uVar17) {
                if (local_c0 != 0) {
                  iVar4 = uVar14 + idx + -2;
                }
                if (iVar4 < (int)(idx + len + -1)) {
                  uVar14 = 0;
                  lVar10 = local_50;
                  do {
                    lVar9 = lVar10;
                    lVar10 = lVar9 + 1;
                    if (iVar4 < lVar10) goto LAB_00138b26;
                    uVar2 = local_70->offset_length_[lVar9 + 2];
                    uVar14 = uVar2 & 0xfff;
                  } while (uVar2 >> 0xc == uVar17);
                  uVar14 = local_70->offset_length_[lVar10] & 0xfff;
LAB_00138b26:
                  iVar4 = (int)lVar9;
                  local_c0 = 0;
                  UpdateCostAtIndex(manager,iVar4,0);
                  UpdateCostAtIndex(manager,iVar4 + 1,0);
                  PushInterval(manager,(double)manager->costs_[iVar4] + local_60,iVar4 + 1,uVar14);
                  iVar4 = iVar4 + uVar14;
                }
                else {
                  local_c0 = 0;
                }
              }
              else {
                distance = VP8LDistanceToPlaneCode(xsize,dist);
                VP8LPrefixEncodeBits(distance,&code,&extra_bits);
                local_60 = (double)extra_bits + local_48[code];
                PushInterval(manager,(double)prev_cost + local_60,idx,len);
                local_c0 = 1;
              }
            }
            UpdateCostAtIndex(manager,idx,1);
            local_50 = local_50 + 1;
            uVar17 = dist;
            uVar14 = len;
          }
          bVar19 = local_58->error_ == 0;
          goto LAB_00138c1f;
        }
      }
      CostManagerClear(manager);
      bVar19 = false;
    }
LAB_00138c1f:
    if (0 < cache_bits) {
      VP8LColorCacheClear(&local_40);
    }
  }
LAB_00138c38:
  CostManagerClear(manager);
  WebPSafeFree(m);
  WebPSafeFree(manager);
  uVar17 = 0;
  if (bVar19) {
    puVar12 = dist_array + local_78;
    puVar18 = puVar12;
    for (puVar6 = dist_array + (local_78 - 1); dist_array <= puVar6;
        puVar6 = (ushort *)((long)puVar6 - (ulong)((uint)uVar1 * 2))) {
      uVar1 = *puVar6;
      puVar18[-1] = uVar1;
      puVar18 = puVar18 + -1;
    }
    if ((cache_bits < 1) ||
       (iVar4 = VP8LColorCacheInit((VP8LColorCache *)&code,cache_bits), iVar4 != 0)) {
      uVar8 = (ulong)((long)puVar12 - (long)puVar18) >> 1;
      VP8LClearBackwardRefs(refs_dst);
      uVar16 = 0;
      uVar13 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar13 = uVar16;
      }
      uVar17 = 0;
      for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        uVar1 = puVar18[uVar16];
        if (uVar1 == 1) {
          if (cache_bits < 1) {
LAB_00138d22:
            uVar14 = argb[uVar17];
            uVar8 = 0x10000;
          }
          else {
            uVar3 = argb[uVar17];
            uVar14 = uVar3 * 0x1e35a7bd >> (local_88 & 0x1f);
            if (((int)uVar14 < 0) ||
               (uVar8 = 0x10001, *(uint32_t *)(&_code->mode + (long)(int)uVar14 * 4) != uVar3)) {
              *(uint32_t *)(&_code->mode + (long)(int)uVar14 * 4) = uVar3;
              goto LAB_00138d22;
            }
          }
          VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar14 << 0x20 | uVar8));
        }
        else {
          VP8LBackwardRefsCursorAdd
                    (refs_dst,(PixOrCopy)
                              ((ulong)CONCAT42(local_70->offset_length_[uVar17] >> 0xc,uVar1) *
                               0x10000 + 2));
          if (0 < cache_bits) {
            for (uVar8 = 0; (uint)uVar1 != uVar8; uVar8 = uVar8 + 1) {
              *(uint32_t *)
               (&_code->mode +
               (long)(int)(argb[uVar17 + uVar8] * 0x1e35a7bd >> (local_88 & 0x1f)) * 4) =
                   argb[uVar17 + uVar8];
            }
          }
        }
        uVar17 = uVar17 + uVar1;
      }
      bVar19 = refs_dst->error_ == 0;
      if (0 < cache_bits) {
        VP8LColorCacheClear((VP8LColorCache *)&code);
      }
    }
    else {
      bVar19 = false;
    }
    uVar17 = (uint)bVar19;
  }
LAB_00138de8:
  WebPSafeFree(dist_array);
  return uVar17;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}